

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HouseholderSequence.h
# Opt level: O1

EssentialVectorType * __thiscall
Eigen::
HouseholderSequence<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_Eigen::VectorBlock<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1>,_1>
::essentialVector(EssentialVectorType *__return_storage_ptr__,
                 HouseholderSequence<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_Eigen::VectorBlock<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1>,_1>
                 *this,Index k)

{
  PointerType pfVar1;
  long lVar2;
  XprTypeNested pMVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((k < 0) || (this->m_length <= k)) {
    __assert_fail("k >= 0 && k < m_length",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Householder/HouseholderSequence.h"
                  ,0xe7,
                  "const EssentialVectorType Eigen::HouseholderSequence<Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, -1, true>, Eigen::VectorBlock<const Eigen::Matrix<float, -1, 1>>>::essentialVector(Index) const [VectorsType = Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, -1, true>, CoeffsType = Eigen::VectorBlock<const Eigen::Matrix<float, -1, 1>>, Side = 1]"
                 );
  }
  uVar6 = this->m_shift + k + 1;
  pfVar1 = (this->m_vectors).
           super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>
           .super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>
           .
           super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>
           .m_data;
  uVar7 = (this->m_vectors).
          super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>
          .super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>
          .m_rows.m_value - uVar6;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_Eigen::Dense>
  ).
  super_BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false>,_0>
  .m_data = pfVar1 + k + this->m_shift +
                     (((this->m_vectors).
                       super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>
                      .m_xpr)->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
                     m_storage.m_rows * k + 1;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_Eigen::Dense>
  ).
  super_BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false>,_0>
  .m_rows.m_value = uVar7;
  if ((long)uVar7 < 0 && pfVar1 != (PointerType)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                  ,0xb2,
                  "Eigen::MapBase<Eigen::Block<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, -1, true>, -1, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, -1, true>, -1, 1>, Level = 0]"
                 );
  }
  pfVar1 = (this->m_vectors).
           super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>
           .super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>
           .
           super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>
           .m_data;
  lVar2 = (this->m_vectors).
          super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>
          .super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>
          .m_rows.m_value;
  pMVar3 = (this->m_vectors).
           super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>
           .super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>
           .m_xpr;
  lVar4 = (this->m_vectors).
          super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>
          .super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
          m_startRow.m_value;
  lVar5 = (this->m_vectors).
          super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>
          .super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
          m_startCol.m_value;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_Eigen::Dense>
  ).
  super_BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>.m_cols
  .m_value = (this->m_vectors).
             super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>
             .m_cols.m_value;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_Eigen::Dense>
  ).
  super_BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.m_xpr =
       pMVar3;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_Eigen::Dense>
  ).
  super_BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
  m_outerStride =
       (this->m_vectors).
       super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
       m_outerStride;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_Eigen::Dense>
  ).
  super_BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
  m_startRow.m_value = lVar4;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_Eigen::Dense>
  ).
  super_BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
  m_startCol.m_value = lVar5;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_Eigen::Dense>
  ).
  super_BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>.m_data
       = pfVar1;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_Eigen::Dense>
  ).
  super_BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>.m_rows
  .m_value = lVar2;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_Eigen::Dense>
  ).
  super_BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_true>
  .m_startRow.m_value = uVar6;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_Eigen::Dense>
  ).
  super_BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_true>
  .m_startCol.m_value = k;
  (__return_storage_ptr__->
  super_BlockImpl<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_Eigen::Dense>
  ).
  super_BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_true>
  .m_outerStride =
       (((__return_storage_ptr__->
         super_BlockImpl<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_Eigen::Dense>
         ).
         super_BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_true>
         .m_xpr.
         super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
        m_xpr)->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if ((-1 < (long)(uVar7 | uVar6)) &&
     (k < (this->m_vectors).
          super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>
          .super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>
          .m_cols.m_value)) {
    return __return_storage_ptr__;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                ,0x93,
                "Eigen::Block<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, -1, true>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, -1, true>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

essentialVector(Index k) const
    {
      eigen_assert(k >= 0 && k < m_length);
      return internal::hseq_side_dependent_impl<VectorsType,CoeffsType,Side>::essentialVector(*this, k);
    }